

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O2

int __thiscall RpcClient::PollResponse(RpcClient *this)

{
  NarpcStaging *this_00;
  int iVar1;
  ostream *poVar2;
  shared_ptr<RpcMessage> response;
  int size;
  unsigned_long_long ticket;
  __shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2> local_68;
  int local_54;
  __shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2> local_40;
  unsigned_long_long local_30;
  
  this_00 = &this->staging_;
  NarpcStaging::Clear(this_00);
  local_54 = 0;
  local_30 = 0;
  NarpcStaging::FetchHeader(this_00,this->socket_,&local_54,&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"receiving size ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_54);
  poVar2 = std::operator<<(poVar2,", ticket ");
  poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &this->responseMap_[local_30].
              super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>);
  NarpcStaging::Clear(this_00);
  iVar1 = this->socket_;
  std::__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,&local_68);
  NarpcStaging::FetchMessage(this_00,iVar1,(shared_ptr<RpcMessage> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"RpcMessage::PollResponse ");
  std::__shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,&local_68);
  poVar2 = operator<<(poVar2,(shared_ptr<RpcMessage> *)&local_50);
  poVar2 = std::operator<<(poVar2," (size ");
  iVar1 = (*(local_68._M_ptr)->_vptr_RpcMessage[3])();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return 0;
}

Assistant:

int RpcClient::PollResponse() {
  // stream_.Clear();
  staging_.Clear();

  // recv narpc header
  // stream_.Read(socket_, kNarpcHeader);

  // int msg_size = stream_.GetInt();
  // long long msg_ticket = stream_.GetLong();
  int size = 0;
  unsigned long long ticket = 0;
  staging_.FetchHeader(socket_, size, ticket);

  cout << "receiving size " << size << ", ticket " << ticket << endl;
  shared_ptr<RpcMessage> response = responseMap_[ticket];

  // stream_.Read(socket_, msg_size);
  // msg_response->Update(stream_);
  staging_.Clear();
  staging_.FetchMessage(socket_, response);
  cout << "RpcMessage::PollResponse " << response << " (size "
       << response->Size() << ")" << endl;

  return 0;
}